

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitArrayNew(FunctionValidator *this,ArrayNew *curr)

{
  Field curr_00;
  bool bVar1;
  Type local_30;
  undefined8 local_28;
  HeapType local_20;
  HeapType heapType;
  
  shouldBeTrue<wasm::ArrayNew*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.new requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNew*,wasm::Type>
            (this,(Type)(curr->size->type).id,(Type)0x2,curr,"array.new size must be an i32");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id != 1) {
    local_20 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)63>).
                           super_Expression.type);
    bVar1 = HeapType::isArray(&local_20);
    bVar1 = shouldBeTrue<wasm::ArrayNew*>(this,bVar1,curr,"array.new heap type must be array");
    if (bVar1) {
      HeapType::getArray((HeapType *)&local_30);
      if (curr->init == (Expression *)0x0) {
        shouldBeTrue<wasm::ArrayNew*>(this,true,curr,"array.new_with_default should have no init");
        bVar1 = wasm::Type::isDefaultable(&local_30);
        curr_00.packedType = (undefined4)local_28;
        curr_00.mutable_ = local_28._4_4_;
        curr_00.type.id = local_30.id;
        shouldBeTrue<wasm::Field>
                  (this,bVar1,curr_00,"array.new_with_default value type must be defaultable");
      }
      else {
        shouldBeTrue<wasm::ArrayNew*>(this,true,curr,"array.new should have an init");
        shouldBeSubType(this,(Type)(curr->init->type).id,local_30,(Expression *)curr,
                        "array.new init must have proper type");
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNew(ArrayNew* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.new requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type, Type(Type::i32), curr, "array.new size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(), curr, "array.new heap type must be array")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  if (curr->isWithDefault()) {
    shouldBeTrue(
      !curr->init, curr, "array.new_with_default should have no init");
    // The element must be defaultable.
    shouldBeTrue(element.type.isDefaultable(),
                 element,
                 "array.new_with_default value type must be defaultable");
  } else {
    shouldBeTrue(!!curr->init, curr, "array.new should have an init");
    // The inits must have the proper type.
    shouldBeSubType(curr->init->type,
                    element.type,
                    curr,
                    "array.new init must have proper type");
  }
}